

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_write_block(cram_fd *fd,cram_block *b)

{
  uint uVar1;
  byte bVar2;
  byte bVar7;
  int iVar3;
  undefined4 uVar4;
  uint32_t val;
  int iVar5;
  size_t sVar6;
  byte bVar8;
  byte bVar9;
  long lVar10;
  byte *pbVar11;
  uchar *puVar12;
  long lStack_90;
  uchar dat [100];
  
  if ((b->method == RAW) && (b->comp_size != b->uncomp_size)) {
    __assert_fail("b->method != RAW || (b->comp_size == b->uncomp_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                  ,0x349,"int cram_write_block(cram_fd *, cram_block *)");
  }
  iVar3 = hputc(b->method,fd->fp);
  iVar5 = -1;
  if ((((iVar3 != -1) && (iVar3 = hputc(b->content_type,fd->fp), iVar3 != -1)) &&
      (iVar3 = itf8_encode(fd,b->content_id), iVar3 != -1)) &&
     ((iVar3 = itf8_encode(fd,b->comp_size), iVar3 != -1 &&
      (iVar3 = itf8_encode(fd,b->uncomp_size), iVar3 != -1)))) {
    if (b->method == RAW) {
      iVar3 = b->uncomp_size;
    }
    else {
      iVar3 = b->comp_size;
    }
    sVar6 = hwrite(fd->fp,b->data,(long)iVar3);
    if (sVar6 == (long)iVar3) {
      if (0x2ff < fd->version) {
        dat[0] = (uchar)b->method;
        dat[1] = (uchar)b->content_type;
        uVar1 = b->content_id;
        bVar2 = (byte)uVar1;
        if (uVar1 < 0x80) {
          lVar10 = 1;
          dat[2] = bVar2;
        }
        else {
          bVar7 = (byte)(uVar1 >> 8);
          if (uVar1 < 0x4000) {
            lVar10 = 2;
            dat[2] = bVar7 | 0x80;
            dat[3] = bVar2;
          }
          else {
            dat[3] = (uchar)(uVar1 >> 0x10);
            if (uVar1 < 0x200000) {
              lVar10 = 3;
              dat[2] = dat[3] | 0xc0;
              dat[3] = bVar7;
              dat[4] = bVar2;
            }
            else {
              bVar8 = (byte)(uVar1 >> 0x18);
              if (uVar1 < 0x10000000) {
                lVar10 = 4;
                dat[2] = bVar8 | 0xe0;
                dat[4] = bVar7;
                dat[5] = bVar2;
              }
              else {
                lVar10 = 5;
                dat[2] = bVar8 >> 4 | 0xf0;
                dat[3] = (uchar)(uVar1 >> 0x14);
                dat[4] = (uchar)(uVar1 >> 0xc);
                dat[5] = (uchar)(uVar1 >> 4);
                dat[6] = bVar2 & 0xf;
              }
            }
          }
        }
        pbVar11 = dat + lVar10 + 2;
        uVar1 = b->comp_size;
        bVar2 = (byte)uVar1;
        if (uVar1 < 0x80) {
          *pbVar11 = bVar2;
          lStack_90 = 1;
        }
        else {
          bVar7 = (byte)(uVar1 >> 8);
          if (uVar1 < 0x4000) {
            *pbVar11 = bVar7 | 0x80;
            dat[lVar10 + 3] = bVar2;
            lStack_90 = 2;
          }
          else {
            bVar8 = (byte)(uVar1 >> 0x10);
            if (uVar1 < 0x200000) {
              *pbVar11 = bVar8 | 0xc0;
              dat[lVar10 + 3] = bVar7;
              dat[lVar10 + 4] = bVar2;
              lStack_90 = 3;
            }
            else {
              bVar9 = (byte)(uVar1 >> 0x18);
              if (uVar1 < 0x10000000) {
                *pbVar11 = bVar9 | 0xe0;
                dat[lVar10 + 3] = bVar8;
                dat[lVar10 + 4] = bVar7;
                dat[lVar10 + 5] = bVar2;
                lStack_90 = 4;
              }
              else {
                *pbVar11 = bVar9 >> 4 | 0xf0;
                dat[lVar10 + 3] = (uchar)(uVar1 >> 0x14);
                dat[lVar10 + 4] = (uchar)(uVar1 >> 0xc);
                dat[lVar10 + 5] = (uchar)(uVar1 >> 4);
                dat[lVar10 + 6] = bVar2 & 0xf;
                lStack_90 = 5;
              }
            }
          }
        }
        pbVar11 = pbVar11 + lStack_90;
        uVar1 = b->uncomp_size;
        bVar2 = (byte)uVar1;
        if (uVar1 < 0x80) {
          iVar5 = 1;
          *pbVar11 = bVar2;
        }
        else {
          bVar7 = (byte)(uVar1 >> 8);
          if (uVar1 < 0x4000) {
            *pbVar11 = bVar7 | 0x80;
            pbVar11[1] = bVar2;
            iVar5 = 2;
          }
          else {
            bVar8 = (byte)(uVar1 >> 0x10);
            if (uVar1 < 0x200000) {
              *pbVar11 = bVar8 | 0xc0;
              pbVar11[1] = bVar7;
              pbVar11[2] = bVar2;
              iVar5 = 3;
            }
            else {
              bVar9 = (byte)(uVar1 >> 0x18);
              if (uVar1 < 0x10000000) {
                *pbVar11 = bVar9 | 0xe0;
                pbVar11[1] = bVar8;
                pbVar11[2] = bVar7;
                pbVar11[3] = bVar2;
                iVar5 = 4;
              }
              else {
                *pbVar11 = bVar9 >> 4 | 0xf0;
                pbVar11[1] = (byte)(uVar1 >> 0x14);
                pbVar11[2] = (byte)(uVar1 >> 0xc);
                pbVar11[3] = (byte)(uVar1 >> 4);
                pbVar11[4] = bVar2 & 0xf;
                iVar5 = 5;
              }
            }
          }
        }
        uVar4 = crc32(0,dat,((int)pbVar11 + iVar5) - (int)dat);
        puVar12 = "";
        if (b->data != (uchar *)0x0) {
          puVar12 = b->data;
        }
        val = crc32(uVar4,puVar12,(&b->comp_size)[b->method == RAW]);
        b->crc32 = val;
        iVar5 = int32_encode(fd,val);
        if (iVar5 == -1) {
          return -1;
        }
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int cram_write_block(cram_fd *fd, cram_block *b) {
    assert(b->method != RAW || (b->comp_size == b->uncomp_size));

    if (hputc(b->method,       fd->fp)  == EOF) return -1;
    if (hputc(b->content_type, fd->fp)  == EOF) return -1;
    if (itf8_encode(fd, b->content_id)  ==  -1) return -1;
    if (itf8_encode(fd, b->comp_size)   ==  -1) return -1;
    if (itf8_encode(fd, b->uncomp_size) ==  -1) return -1;

    if (b->method == RAW) {
	if (b->uncomp_size != hwrite(fd->fp, b->data, b->uncomp_size))
	    return -1;
    } else {
	if (b->comp_size != hwrite(fd->fp, b->data, b->comp_size))
	    return -1;
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	unsigned char dat[100], *cp = dat;;
	uint32_t crc;

	*cp++ = b->method;
	*cp++ = b->content_type;
	cp += itf8_put(cp, b->content_id);
	cp += itf8_put(cp, b->comp_size);
	cp += itf8_put(cp, b->uncomp_size);
	crc = crc32(0L, dat, cp-dat);

	if (b->method == RAW) {
	    b->crc32 = crc32(crc, b->data ? b->data : (uc*)"", b->uncomp_size);
	} else {
	    b->crc32 = crc32(crc, b->data ? b->data : (uc*)"", b->comp_size);
	}

	if (-1 == int32_encode(fd, b->crc32))
	    return -1;
    }

    return 0;
}